

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,false,true>>>
               (Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
                *mb)

{
  undefined8 uVar1;
  reference __x;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar2;
  bool bVar3;
  lazy_ostream *plVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference bar;
  Cycle *__y;
  basic_cstring<const_char> local_3c0;
  basic_cstring<const_char> local_3b0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_3a0;
  assertion_result local_380;
  basic_cstring<const_char> local_368;
  basic_cstring<const_char> local_358;
  reference local_348;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *cycle;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *__range2;
  const_iterator it;
  Barcode *barcode;
  basic_cstring<const_char> local_308;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2f8;
  assertion_result local_2d8;
  basic_cstring<const_char> local_2c0;
  basic_cstring<const_char> local_2b0;
  value_type_conflict1 local_29c;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_278;
  assertion_result local_258;
  basic_cstring<const_char> local_240;
  basic_cstring<const_char> local_230;
  value_type_conflict1 local_220 [2];
  basic_cstring<const_char> local_218;
  basic_cstring<const_char> local_208;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1f8;
  assertion_result local_1d8;
  basic_cstring<const_char> local_1c0;
  basic_cstring<const_char> local_1b0;
  basic_cstring<const_char> local_1a0;
  basic_cstring<const_char> local_190;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_180;
  assertion_result local_160;
  basic_cstring<const_char> local_148;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  basic_cstring<const_char> local_118;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_108;
  assertion_result local_e8;
  basic_cstring<const_char> local_d0;
  basic_cstring<const_char> local_c0;
  value_type_conflict1 local_ac;
  undefined1 local_a8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  size_type local_88 [3];
  basic_cstring<const_char> local_70;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_60;
  basic_cstring<const_char> local_38;
  basic_cstring<const_char> local_28;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_18;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *cycles;
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
  *mb_local;
  
  cycles = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)mb;
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
  ::update_representative_cycles(mb);
  local_18 = Gudhi::persistence_matrix::
             Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
             ::get_representative_cycles
                       ((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
                         *)cycles);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_38);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_28,0x9c7,&local_38);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_60,plVar4,(char (*) [1])0x2a320d);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_70,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    local_88[0] = std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::size(local_18);
    tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_60,&local_70,0x9c7,1,2,local_88,"cycles.size()",
               (undefined1 *)
               ((long)&tmp.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_60);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_ac = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,&local_ac);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c0,0x9cc,&local_d0);
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](local_18,0);
    bVar3 = std::operator==(pvVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    boost::test_tools::assertion_result::assertion_result(&local_e8,bVar3);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_118,"cycles[0] == tmp",0x10);
    boost::unit_test::operator<<(&local_108,plVar4,&local_118);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_e8,&local_108,&local_128,0x9cc,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_108);
    boost::test_tools::assertion_result::~assertion_result(&local_e8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0);
  *pvVar6 = 1;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_138,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_148);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_138,0x9ce,&local_148);
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](local_18,1);
    bVar3 = std::operator==(pvVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    boost::test_tools::assertion_result::assertion_result(&local_160,bVar3);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_190,"cycles[1] == tmp",0x10);
    boost::unit_test::operator<<(&local_180,plVar4,&local_190);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_160,&local_180,&local_1a0,0x9ce,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_180);
    boost::test_tools::assertion_result::~assertion_result(&local_160);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0);
  *pvVar6 = 2;
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1b0,0x9d0,&local_1c0);
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](local_18,2);
    bVar3 = std::operator==(pvVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    boost::test_tools::assertion_result::assertion_result(&local_1d8,bVar3);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_208,"cycles[2] == tmp",0x10);
    boost::unit_test::operator<<(&local_1f8,plVar4,&local_208);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_218,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1d8,&local_1f8,&local_218,0x9d0,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1f8);
    boost::test_tools::assertion_result::~assertion_result(&local_1d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,0);
  *pvVar6 = 3;
  local_220[1] = 4;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,local_220 + 1);
  local_220[0] = 5;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,local_220);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_230,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_240);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_230,0x9d4,&local_240);
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](local_18,3);
    bVar3 = std::operator==(pvVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    boost::test_tools::assertion_result::assertion_result(&local_258,bVar3);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,"cycles[3] == tmp",0x10);
    boost::unit_test::operator<<(&local_278,plVar4,&local_288);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_258,&local_278,&local_298,0x9d4,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_278);
    boost::test_tools::assertion_result::~assertion_result(&local_258);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  local_29c = 7;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8,&local_29c);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2b0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2c0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_2b0,0x9d7,&local_2c0);
    pvVar5 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator[](local_18,4);
    bVar3 = std::operator==(pvVar5,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
    boost::test_tools::assertion_result::assertion_result(&local_2d8,bVar3);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_308,"cycles[4] == tmp",0x10);
    boost::unit_test::operator<<(&local_2f8,plVar4,&local_308);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)&barcode,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2d8,&local_2f8,&barcode,0x9d7,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2f8);
    boost::test_tools::assertion_result::~assertion_result(&local_2d8);
    bVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_a8);
  it._M_current =
       (Persistence_interval<int,_unsigned_int> *)
       Gudhi::persistence_matrix::
       Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
       ::get_current_barcode
                 ((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
                   *)cycles);
  __range2 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)std::
                vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ::begin((vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                         *)it._M_current);
  pvVar2 = local_18;
  __end0 = std::
           vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::begin(local_18);
  cycle = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::end(pvVar2);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                                *)&cycle);
    if (!bVar3) break;
    local_348 = __gnu_cxx::
                __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
                ::operator*(&__end0);
    do {
      uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_358,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_368);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_358,0x9ee,&local_368);
      pvVar2 = cycles;
      __x = local_348;
      bar = __gnu_cxx::
            __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
            ::operator*((__normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
                         *)&__range2);
      __y = Gudhi::persistence_matrix::
            Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
            ::get_representative_cycle
                      ((Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_false,_true>_>
                        *)pvVar2,bar);
      bVar3 = std::operator==(__x,__y);
      boost::test_tools::assertion_result::assertion_result(&local_380,bVar3);
      plVar4 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3b0,"cycle == mb.get_representative_cycle(*it)",0x29);
      boost::unit_test::operator<<(&local_3a0,plVar4,&local_3b0);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                 ,0x73);
      boost::test_tools::tt_detail::report_assertion(&local_380,&local_3a0,&local_3c0,0x9ee,1,0,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl(&local_3a0);
      boost::test_tools::assertion_result::~assertion_result(&local_380);
      bVar3 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar3);
    __gnu_cxx::
    __normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
    ::operator++((__normal_iterator<const_Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_*,_std::vector<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>_>
                  *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void test_representative_cycles(Matrix& mb) {
  mb.update_representative_cycles();

  const auto& cycles = mb.get_representative_cycles();
  BOOST_CHECK_EQUAL(cycles.size(), 5);

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp[0] = 1;
    BOOST_CHECK(cycles[1] == tmp);
    tmp[0] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp.push_back(4);
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp.clear();
    tmp.push_back(7);
    BOOST_CHECK(cycles[4] == tmp);
  } else {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp.push_back(1);
    BOOST_CHECK(cycles[1] == tmp);
    tmp[1] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp[1] = 4;
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp[0] = 0;
    tmp[1] = 7;
    tmp.pop_back();
    BOOST_CHECK(cycles[4] == tmp);
  }

  if constexpr (Matrix::Option_list::has_column_pairings) {
    const auto& barcode = mb.get_current_barcode();
    auto it = barcode.begin();
    for (auto& cycle : cycles) {
      BOOST_CHECK(cycle == mb.get_representative_cycle(*it));
      ++it;
    }
  }
}